

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O3

bool __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess::operator()
          (SuffixNameLess *this,SuffixImpl *lhs,SuffixImpl *rhs)

{
  ulong __n;
  ulong uVar1;
  int iVar2;
  
  __n = (lhs->name).size_;
  uVar1 = (rhs->name).size_;
  if (__n != uVar1) {
    return __n < uVar1;
  }
  if (__n != 0) {
    iVar2 = memcmp((lhs->name).data_,(rhs->name).data_,__n);
    return SUB41((uint)iVar2 >> 0x1f,0);
  }
  return false;
}

Assistant:

bool operator()(const SuffixImpl &lhs, const SuffixImpl &rhs) const {
      std::size_t lhs_size = lhs.name.size(), rhs_size = rhs.name.size();
      if (lhs_size != rhs_size)
        return lhs_size < rhs_size;
      auto cmp = std::char_traits<char>::compare(
            lhs.name.data(), rhs.name.data(), lhs_size);
      return cmp<0;
      /// Don't compare kind_pure() because BasicProb
      /// has own suffix set for each kind
    }